

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::~QMakeEvaluator(QMakeEvaluator *this)

{
  ProFunctionDefs *pPVar1;
  ProFunctionDefs *in_RDI;
  ProFunctionDefs *local_10;
  
  pPVar1 = in_RDI + 0x26;
  local_10 = in_RDI + 0x29;
  do {
    local_10 = (ProFunctionDefs *)&local_10[-2].replaceFunctions;
    QString::~QString((QString *)0x2ef6ad);
  } while (local_10 != pPVar1);
  QString::~QString((QString *)0x2ef6d1);
  QString::~QString((QString *)0x2ef6e2);
  QString::~QString((QString *)0x2ef6f3);
  ProValueMapStack::~ProValueMapStack((ProValueMapStack *)0x2ef704);
  ProStringList::~ProStringList((ProStringList *)0x2ef715);
  ProFunctionDefs::~ProFunctionDefs(in_RDI);
  ProString::~ProString((ProString *)0x2ef737);
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)in_RDI);
  QList<QString>::~QList((QList<QString> *)0x2ef759);
  QList<QString>::~QList((QList<QString> *)0x2ef76a);
  QList<QString>::~QList((QList<QString> *)0x2ef77b);
  QString::~QString((QString *)0x2ef78c);
  QString::~QString((QString *)0x2ef79d);
  QString::~QString((QString *)0x2ef7ae);
  QString::~QString((QString *)0x2ef7bf);
  QString::~QString((QString *)0x2ef7d0);
  QString::~QString((QString *)0x2ef7e1);
  QString::~QString((QString *)0x2ef7f2);
  QString::~QString((QString *)0x2ef803);
  QString::~QString((QString *)0x2ef811);
  ProStringList::~ProStringList((ProStringList *)0x2ef81f);
  QMap<ProKey,_ProStringList>::~QMap((QMap<ProKey,_ProStringList> *)0x2ef82d);
  QStack<ProFile_*>::~QStack((QStack<ProFile_*> *)0x2ef83b);
  QStack<QMakeEvaluator::Location>::~QStack((QStack<QMakeEvaluator::Location> *)0x2ef849);
  return;
}

Assistant:

QMakeEvaluator::~QMakeEvaluator()
{
}